

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

void __thiscall cmCTestHG::LogParser::LogParser(LogParser *this,cmCTestHG *hg,char *prefix)

{
  cmProcessTools::OutputLogger::OutputLogger
            (&this->super_OutputLogger,(hg->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_0070e268;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_0070e2b8;
  this->HG = hg;
  (this->Rev).Rev._M_dataplus._M_p = (pointer)&(this->Rev).Rev.field_2;
  (this->Rev).Rev._M_string_length = 0;
  (this->Rev).Rev.field_2._M_local_buf[0] = '\0';
  (this->Rev).Date._M_dataplus._M_p = (pointer)&(this->Rev).Date.field_2;
  (this->Rev).Date._M_string_length = 0;
  (this->Rev).Date.field_2._M_local_buf[0] = '\0';
  (this->Rev).Author._M_dataplus._M_p = (pointer)&(this->Rev).Author.field_2;
  (this->Rev).Author._M_string_length = 0;
  (this->Rev).Author.field_2._M_local_buf[0] = '\0';
  (this->Rev).EMail._M_dataplus._M_p = (pointer)&(this->Rev).EMail.field_2;
  (this->Rev).EMail._M_string_length = 0;
  (this->Rev).EMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).Committer._M_dataplus._M_p = (pointer)&(this->Rev).Committer.field_2;
  (this->Rev).Committer._M_string_length = 0;
  (this->Rev).Committer.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitterEMail._M_dataplus._M_p = (pointer)&(this->Rev).CommitterEMail.field_2;
  (this->Rev).CommitterEMail._M_string_length = 0;
  (this->Rev).CommitterEMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitDate._M_dataplus._M_p = (pointer)&(this->Rev).CommitDate.field_2;
  (this->Rev).CommitDate._M_string_length = 0;
  (this->Rev).CommitDate.field_2._M_local_buf[0] = '\0';
  (this->Rev).Log._M_dataplus._M_p = (pointer)&(this->Rev).Log.field_2;
  (this->Rev).Log._M_string_length = 0;
  (this->Rev).Log.field_2._M_local_buf[0] = '\0';
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CurChange).Action = '?';
  (this->CurChange).Path._M_dataplus._M_p = (pointer)&(this->CurChange).Path.field_2;
  (this->CurChange).Path._M_string_length = 0;
  (this->CurChange).Path.field_2._M_local_buf[0] = '\0';
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmXMLParser::InitializeParser(&this->super_cmXMLParser);
  return;
}

Assistant:

LogParser(cmCTestHG* hg, const char* prefix)
    : OutputLogger(hg->Log, prefix)
    , HG(hg)
  {
    this->InitializeParser();
  }